

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfad.h
# Opt level: O0

TFad<6,_double> * __thiscall
TFad<6,double>::operator=
          (TFad<6,_double> *this,
          TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFad<6,_double>_>_> *fadexpr)

{
  TFad<6,_double> *in_RDI;
  value_type vVar1;
  int i;
  int in_stack_ffffffffffffffdc;
  int local_14;
  
  for (local_14 = 0; local_14 < 6; local_14 = local_14 + 1) {
    vVar1 = TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFad<6,_double>_>_>::dx
                      ((TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFad<6,_double>_>_> *)in_RDI,
                       in_stack_ffffffffffffffdc);
    in_RDI->dx_[local_14] = vVar1;
  }
  vVar1 = TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFad<6,_double>_>_>::val
                    ((TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b480c);
  in_RDI->val_ = vVar1;
  return in_RDI;
}

Assistant:

inline TFad<Num,T> & TFad<Num,T>::operator=(const TFadExpr<ExprT>& fadexpr) 
{
  for(int i=0; i<Num; ++i)
    dx_[i] = fadexpr.dx(i);
  
  val_ = fadexpr.val();
  
  return *this;
}